

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_write.cpp
# Opt level: O2

int main(void)

{
  uint8_t *puVar1;
  string_ref str;
  chars local_259;
  excerpt_appender appender;
  vanilla_chronicle_settings settings;
  vanilla_chronicle chronicle;
  
  std::__cxx11::string::string((string *)&chronicle,"/tmp/example",(allocator *)&appender);
  cornelich::vanilla_chronicle_settings::vanilla_chronicle_settings(&settings,(string *)&chronicle);
  std::__cxx11::string::~string((string *)&chronicle);
  cornelich::vanilla_chronicle::vanilla_chronicle(&chronicle,&settings);
  cornelich::vanilla_chronicle::create_appender(&appender,&chronicle);
  cornelich::excerpt_appender::start_excerpt(&appender,0x400);
  puVar1 = appender.m_buffer.m_data + appender.m_buffer.m_position;
  puVar1[0] = '*';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  appender.m_buffer.m_position = appender.m_buffer.m_position + 4;
  str.len_ = 9;
  str.ptr_ = "Some text";
  cornelich::writers::chars::operator()
            (&local_259,appender.m_buffer.m_data,&appender.m_buffer.m_position,str);
  cornelich::excerpt_appender::finish(&appender);
  cornelich::excerpt_appender::~excerpt_appender(&appender);
  cornelich::vanilla_chronicle::~vanilla_chronicle(&chronicle);
  cornelich::vanilla_chronicle_settings::~vanilla_chronicle_settings(&settings);
  return 0;
}

Assistant:

int main()
{
    chr::vanilla_chronicle_settings settings("/tmp/example");
    chr::vanilla_chronicle chronicle(settings);

    auto appender = chronicle.create_appender();
    appender.start_excerpt(1024);
    appender.write(42);
    appender.write("Some text", chr::writers::chars());
    appender.finish();
}